

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  allocator local_39;
  string command;
  
  fasttext::utils::initTables();
  if (argc < 2) {
    printUsage();
    goto LAB_00111e59;
  }
  std::__cxx11::string::string((string *)&command,argv[1],&local_39);
  bVar1 = std::operator==(&command,"skipgram");
  if (bVar1) {
LAB_00111e30:
    train(argc,argv);
    fasttext::utils::freeTables();
    std::__cxx11::string::~string((string *)&command);
    return 0;
  }
  bVar1 = std::operator==(&command,"cbow");
  if (bVar1) goto LAB_00111e30;
  bVar1 = std::operator==(&command,"supervised");
  if (bVar1) goto LAB_00111e30;
  bVar1 = std::operator==(&command,"test");
  if (bVar1) {
    test(argc,argv);
  }
  bVar1 = std::operator==(&command,"print-vectors");
  if (bVar1) {
    printVectors(argc,argv);
  }
  bVar1 = std::operator==(&command,"predict");
  if (bVar1) {
LAB_00111ec9:
    predict(argc,argv);
  }
  else {
    bVar1 = std::operator==(&command,"predict-prob");
    if (bVar1) goto LAB_00111ec9;
  }
  printUsage();
LAB_00111e59:
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
  utils::initTables();
  if (argc < 2) {
    printUsage();
    exit(EXIT_FAILURE);
  }
  std::string command(argv[1]);
  if (command == "skipgram" || command == "cbow" || command == "supervised") {
    train(argc, argv);
  } else if (command == "test") {
    test(argc, argv);
  } else if (command == "print-vectors") {
    printVectors(argc, argv);
  } else if (command == "predict" || command == "predict-prob" ) {
    predict(argc, argv);
  } else {
    printUsage();
    exit(EXIT_FAILURE);
  }
  utils::freeTables();
  return 0;
}